

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrUuid *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *pvVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408 [32];
  ostringstream local_3e8 [8];
  ostringstream oss_data;
  __cxx11 local_270 [32];
  string local_250 [8];
  string data_array_prefix;
  uint local_22c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [4];
  uint32_t value_data_inc;
  ostringstream local_208 [8];
  ostringstream oss_data_array;
  string local_90 [8];
  string data_prefix;
  XrUuid local_60 [2];
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_40;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrUuid *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_40 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrUuid *)gen_dispatch_table;
  PointerToHexString<XrUuid>(local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"data");
  std::__cxx11::ostringstream::ostringstream(local_208);
  poVar2 = std::operator<<((ostream *)local_208,"0x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
  std::operator<<(poVar2,(uchar *)prefix_local);
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [9])0x301919,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,local_228
            );
  std::__cxx11::string::~string((string *)local_228);
  for (local_22c = 0; local_22c < 0x10; local_22c = local_22c + 1) {
    std::__cxx11::string::string(local_250,local_90);
    std::__cxx11::string::operator+=(local_250,"[");
    std::__cxx11::to_string(local_270,local_22c);
    std::__cxx11::string::operator+=(local_250,(string *)local_270);
    std::__cxx11::string::~string((string *)local_270);
    std::__cxx11::string::operator+=(local_250,"]");
    std::__cxx11::ostringstream::ostringstream(local_3e8);
    poVar2 = std::operator<<((ostream *)local_3e8,"0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    std::operator<<(poVar2,(uchar)prefix_local[local_22c]);
    pvVar1 = local_40;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
              (pvVar1,(char (*) [8])"uint8_t",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
               local_408);
    std::__cxx11::string::~string((string *)local_408);
    std::__cxx11::ostringstream::~ostringstream(local_3e8);
    std::__cxx11::string::~string(local_250);
  }
  gen_dispatch_table_local._7_1_ = 1;
  std::__cxx11::ostringstream::~ostringstream(local_208);
  std::__cxx11::string::~string(local_90);
  return (bool)(gen_dispatch_table_local._7_1_ & 1);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrUuid* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string data_prefix = prefix;
        data_prefix += "data";
        std::ostringstream oss_data_array;
        oss_data_array << "0x" << std::hex << (value->data);
        contents.emplace_back("uint8_t*", data_prefix, oss_data_array.str());
        for (uint32_t value_data_inc = 0; value_data_inc < XR_UUID_SIZE; ++value_data_inc) {
            std::string data_array_prefix = data_prefix;
            data_array_prefix += "[";
            data_array_prefix += std::to_string(value_data_inc);
            data_array_prefix += "]";
            std::ostringstream oss_data;
            oss_data << "0x" << std::hex << (value->data[value_data_inc]);
            contents.emplace_back("uint8_t", data_array_prefix, oss_data.str());
        }
        return true;
    } catch(...) {
    }
    return false;
}